

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O2

void __thiscall
AssertionTest_assertLeHandlerShouldNotBeCalled_Test::
AssertionTest_assertLeHandlerShouldNotBeCalled_Test
          (AssertionTest_assertLeHandlerShouldNotBeCalled_Test *this)

{
  AssertionTest::AssertionTest(&this->super_AssertionTest);
  (this->super_AssertionTest).super_Test._vptr_Test = (_func_int **)&PTR__AssertionTest_00176210;
  return;
}

Assistant:

TEST_F(AssertionTest, assertLeHandlerShouldNotBeCalled)
{
    std::int32_t a = 1;
    std::int32_t b = 1;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);
    a = 0;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_LE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}